

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Segment *ppAVar1;
  long lVar2;
  byte bVar3;
  undefined2 uVar4;
  short sVar5;
  AF_Direction AVar6;
  long lVar7;
  AF_StyleMetrics_conflict pAVar8;
  FT_Memory memory;
  bool bVar9;
  char cVar10;
  FT_Error FVar11;
  AF_AxisHints axis_00;
  ulong uVar12;
  FT_Long FVar13;
  long lVar14;
  AF_Edge_conflict pAVar15;
  long lVar16;
  AF_Edge_conflict pAVar17;
  int iVar18;
  AF_Point_conflict pAVar19;
  AF_Segment_conflict pAVar20;
  AF_Segment pAVar21;
  ulong uVar22;
  AF_Edge_conflict pAVar23;
  AF_Segment pAVar24;
  AF_Segment pAVar25;
  ushort uVar26;
  ushort uVar27;
  int iVar28;
  AF_Segment_conflict pAVar29;
  ulong uVar30;
  AF_Segment pAVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  short sVar37;
  uint uVar38;
  AF_Segment_conflict pAVar39;
  AF_Segment_conflict seg;
  AF_Segment_conflict pAVar40;
  int iVar41;
  AF_Edge *ppAVar42;
  AF_AxisHints axis;
  AF_Edge_conflict local_68;
  AF_Segment_conflict local_58;
  AF_Edge_conflict local_38;
  
  uVar22 = (ulong)dim;
  axis_00 = hints->axis + uVar22;
  pAVar40 = hints->axis[uVar22].segments;
  if (pAVar40 == (AF_Segment_conflict)0x0) {
    FVar11 = af_latin_hints_compute_segments(hints,dim);
    if (FVar11 != 0) {
      return FVar11;
    }
  }
  else {
    uVar38 = axis_00->num_segments;
    FVar11 = af_latin_hints_compute_segments(hints,dim);
    if (FVar11 != 0) {
      return FVar11;
    }
    if (uVar38 != 0) {
      pAVar39 = pAVar40 + uVar38;
      do {
        pAVar19 = pAVar40->first;
        uVar26 = pAVar19->flags;
        bVar3 = pAVar40->flags;
        pAVar40->flags = bVar3 & 0xfe;
        if (pAVar19 != pAVar40->last) {
          uVar26 = uVar26 & 3;
          do {
            pAVar19 = pAVar19->next;
            uVar27 = pAVar19->flags & 3;
            if (uVar26 == 0 && uVar27 == 0) goto LAB_00268c1c;
            uVar26 = uVar27;
          } while (pAVar19 != pAVar40->last);
          pAVar40->flags = bVar3 | 1;
        }
LAB_00268c1c:
        pAVar40 = pAVar40 + 1;
      } while (pAVar40 < pAVar39);
    }
  }
  pAVar40 = hints->axis[uVar22].segments;
  if (pAVar40 == (AF_Segment_conflict)0x0) {
    pAVar39 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar39 = pAVar40 + axis_00->num_segments;
  }
  AVar6 = hints->axis[uVar22].major_dir;
  uVar38 = *(uint *)&hints->metrics[1].style_class;
  uVar12 = (ulong)(dim != AF_DIMENSION_HORZ) * 0x10;
  FVar13 = FT_DivFix(0xc0,*(FT_Long *)((long)hints->axis[0].embedded.segments + (uVar12 - 0x68)));
  if (pAVar40 < pAVar39) {
    lVar16 = 0;
    pAVar20 = pAVar40;
    do {
      lVar14 = lVar16;
      pAVar29 = pAVar40;
      if (AVar6 == pAVar20->dir) {
        do {
          if (((lVar14 != 0) && (pAVar29->dir + AVar6 == 0)) &&
             (lVar32 = (long)pAVar29->pos - (long)pAVar20->pos, -1 < lVar32)) {
            uVar4 = pAVar20->max_coord;
            sVar37 = pAVar29->min_coord;
            if (pAVar29->min_coord < pAVar20->min_coord) {
              sVar37 = pAVar20->min_coord;
            }
            sVar5 = pAVar29->max_coord;
            if ((short)uVar4 < sVar5) {
              sVar5 = uVar4;
            }
            lVar34 = (long)sVar5 - (long)sVar37;
            if ((long)(ulong)(uVar38 >> 8) <= lVar34) {
              lVar2 = lVar32 * 8;
              lVar7 = pAVar20->score;
              if ((SBORROW8(lVar2,lVar7 * 9) != lVar2 + lVar7 * -9 < 0) &&
                 ((lVar2 < lVar7 * 7 || (pAVar20->len < lVar34)))) {
                pAVar20->score = lVar32;
                pAVar20->len = lVar34;
                pAVar20->link = pAVar29;
              }
              lVar7 = pAVar29->score;
              if ((SBORROW8(lVar2,lVar7 * 9) != lVar2 + lVar7 * -9 < 0) &&
                 ((lVar2 < lVar7 * 7 || (pAVar29->len < lVar34)))) {
                pAVar29->score = lVar32;
                pAVar29->len = lVar34;
                pAVar29->link = pAVar20;
              }
            }
          }
          pAVar29 = pAVar29 + 1;
          lVar14 = lVar14 + -0x50;
        } while (pAVar29 < pAVar39);
      }
      pAVar20 = pAVar20 + 1;
      lVar16 = lVar16 + 0x50;
      pAVar21 = pAVar40;
    } while (pAVar20 < pAVar39);
    do {
      pAVar31 = pAVar21->link;
      if ((pAVar31 != (AF_Segment)0x0) && (pAVar31->link == pAVar21)) {
        sVar37 = pAVar31->pos;
        sVar5 = pAVar21->pos;
        if ((sVar5 < sVar37) && (lVar16 = pAVar21->score, lVar16 < FVar13)) {
          pAVar20 = pAVar40;
          do {
            if (((((pAVar21 != pAVar20 && pAVar20->pos <= sVar5) &&
                  (pAVar25 = pAVar20->link, pAVar25 != (AF_Segment)0x0)) &&
                 (pAVar25->link == pAVar20)) && (sVar37 <= pAVar25->pos)) &&
               (((sVar5 != pAVar20->pos || (sVar37 != pAVar25->pos)) &&
                ((lVar14 = pAVar20->score, lVar16 < lVar14 &&
                 (lVar16 * 4 - lVar14 != 0 && lVar14 <= lVar16 * 4)))))) {
              pAVar29 = pAVar40;
              if (SBORROW8(pAVar21->len,pAVar20->len * 3) != pAVar21->len + pAVar20->len * -3 < 0) {
                pAVar31->link = (AF_Segment)0x0;
                pAVar21->link = (AF_Segment)0x0;
                break;
              }
              do {
                pAVar24 = pAVar31;
                if ((pAVar29->link == pAVar20) || (pAVar24 = pAVar21, pAVar29->link == pAVar25)) {
                  pAVar29->link = (AF_Segment)0x0;
                  pAVar29->serif = pAVar24;
                }
                pAVar29 = pAVar29 + 1;
              } while (pAVar29 < pAVar39);
            }
            pAVar20 = pAVar20 + 1;
          } while (pAVar20 < pAVar39);
        }
      }
      pAVar21 = pAVar21 + 1;
    } while (pAVar21 < pAVar39);
    do {
      pAVar21 = pAVar40->link;
      if ((pAVar21 != (AF_Segment)0x0) && (pAVar40 != pAVar21->link)) {
        pAVar40->link = (AF_Segment)0x0;
        if ((pAVar21->score < FVar13) || (pAVar40->score < pAVar21->score * 4)) {
          pAVar40->serif = pAVar21->link;
        }
      }
      pAVar40 = pAVar40 + 1;
    } while (pAVar40 < pAVar39);
  }
  pAVar8 = hints->metrics;
  pAVar40 = hints->axis[uVar22].segments;
  if (pAVar40 == (AF_Segment_conflict)0x0) {
    local_58 = (AF_Segment_conflict)0x0;
  }
  else {
    local_58 = pAVar40 + axis_00->num_segments;
  }
  memory = hints->memory;
  hints->axis[uVar22].num_edges = 0;
  FVar13 = *(FT_Long *)((long)hints->axis[0].embedded.segments + ((uVar12 | 8) - 0x70));
  lVar16 = *(long *)((long)pAVar8 + uVar22 * 0x3bf0 + 0x1e8);
  lVar32 = (long)(int)FVar13;
  lVar14 = (int)lVar16 * lVar32;
  if (0x10 < (int)((ulong)(lVar14 + (lVar14 >> 0x3f) + 0x8000) >> 0x10)) {
    lVar16 = FT_DivFix(0x10,FVar13);
  }
  do {
    if (local_58 <= pAVar40) {
      pAVar17 = hints->axis[uVar22].edges;
      if ((pAVar17 != (AF_Edge_conflict)0x0) &&
         (uVar22 = (ulong)hints->axis[uVar22].num_edges, uVar22 != 0)) {
        pAVar15 = pAVar17 + uVar22;
        pAVar23 = pAVar17;
        do {
          pAVar21 = pAVar23->first;
          pAVar31 = pAVar21;
          if (pAVar21 != (AF_Segment)0x0) {
            do {
              pAVar31->edge = pAVar23;
              ppAVar1 = &pAVar31->edge_next;
              pAVar31 = *ppAVar1;
            } while (*ppAVar1 != pAVar21);
          }
          pAVar23 = pAVar23 + 1;
        } while (pAVar23 < pAVar15);
        do {
          pAVar21 = pAVar17->first;
          if (pAVar21 == (AF_Segment)0x0) {
            iVar18 = 0;
            iVar28 = 0;
          }
          else {
            iVar18 = 0;
            iVar28 = 0;
            pAVar31 = pAVar21;
            do {
              bVar3 = pAVar31->flags;
              pAVar25 = pAVar31->serif;
              if (pAVar25 == (AF_Segment)0x0) {
                pAVar24 = pAVar31->link;
                if (pAVar31->link != (AF_Segment)0x0) {
LAB_002691ab:
                  pAVar25 = pAVar24;
                  bVar9 = false;
                  ppAVar42 = &pAVar17->link;
                  goto LAB_002691b0;
                }
              }
              else if ((pAVar31->link != (AF_Segment)0x0) || (pAVar25->edge != pAVar17)) {
                pAVar24 = pAVar31->link;
                if (pAVar25->edge == pAVar17) goto LAB_002691ab;
                bVar9 = true;
                ppAVar42 = &pAVar17->serif;
LAB_002691b0:
                pAVar23 = *ppAVar42;
                if (pAVar23 == (AF_Edge_conflict)0x0) {
LAB_002691f7:
                  pAVar23 = pAVar25->edge;
                }
                else {
                  iVar41 = (int)pAVar17->fpos - (int)pAVar23->fpos;
                  uVar26 = (ushort)iVar41;
                  uVar27 = -uVar26;
                  if (0 < iVar41) {
                    uVar27 = uVar26;
                  }
                  sVar37 = pAVar31->pos;
                  sVar5 = pAVar25->pos;
                  iVar41 = (int)sVar5 - (int)sVar37;
                  if (sVar5 < sVar37) {
                    iVar41 = (int)sVar37 - (int)sVar5;
                  }
                  if (iVar41 < (int)(uint)uVar27) goto LAB_002691f7;
                }
                if (bVar9) {
                  pAVar17->serif = pAVar23;
                  pAVar23->flags = pAVar23->flags | 2;
                }
                else {
                  pAVar17->link = pAVar23;
                }
              }
              uVar38 = bVar3 & 1;
              iVar18 = iVar18 + uVar38;
              iVar28 = iVar28 + (uint)(byte)((byte)uVar38 ^ 1);
              pAVar31 = pAVar31->edge_next;
            } while (pAVar31 != pAVar21);
          }
          pAVar17->flags = iVar28 <= iVar18 && 0 < iVar18;
          if ((pAVar17->serif != (AF_Edge)0x0) && (pAVar17->link != (AF_Edge)0x0)) {
            pAVar17->serif = (AF_Edge)0x0;
          }
          pAVar17 = pAVar17 + 1;
        } while (pAVar17 < pAVar15);
      }
      return 0;
    }
    uVar12 = (ulong)hints->axis[uVar22].num_edges;
    if (uVar12 == 0) {
      cVar10 = pAVar40->dir;
LAB_00269070:
      FVar11 = af_axis_hints_new_edge(axis_00,(int)pAVar40->pos,(int)cVar10,'\0',memory,&local_38);
      if (FVar11 != 0) {
        return FVar11;
      }
      local_38->link = (AF_Edge)0x0;
      local_38->serif = (AF_Edge)0x0;
      local_38->scale = 0;
      local_38->blue_edge = (AF_Width)0x0;
      local_38->pos = 0;
      local_38->flags = '\0';
      local_38->dir = '\0';
      *(undefined6 *)&local_38->field_0x1a = 0;
      *(undefined8 *)local_38 = 0;
      local_38->opos = 0;
      *(undefined8 *)&local_38->score = 0;
      local_38->first = pAVar40;
      local_38->last = pAVar40;
      local_38->dir = pAVar40->dir;
      sVar37 = pAVar40->pos;
      local_38->fpos = sVar37;
      lVar14 = sVar37 * lVar32;
      lVar14 = lVar14 + (lVar14 >> 0x3f) + 0x8000 >> 0x10;
      local_38->opos = lVar14;
      local_38->pos = lVar14;
      pAVar40->edge_next = pAVar40;
    }
    else {
      pAVar17 = hints->axis[uVar22].edges;
      cVar10 = pAVar40->dir;
      uVar30 = 0xffff;
      uVar33 = 0;
      local_68 = (AF_Edge_conflict)0x0;
      do {
        if (pAVar17[uVar33].dir == cVar10) {
          pAVar23 = pAVar17 + uVar33;
          uVar35 = (int)pAVar40->pos - (int)pAVar23->fpos;
          uVar38 = -uVar35;
          if (0 < (int)uVar35) {
            uVar38 = uVar35;
          }
          uVar36 = (ulong)uVar38 & 0xffff;
          if (uVar36 < uVar30 && (long)uVar36 < lVar16) {
            if (pAVar40->link != (AF_Segment)0x0) {
              lVar14 = 0;
              pAVar21 = pAVar23->first;
              do {
                if (pAVar21->link != (AF_Segment)0x0) {
                  sVar37 = pAVar40->link->pos;
                  sVar5 = pAVar21->link->pos;
                  iVar18 = (int)sVar5 - (int)sVar37;
                  if (sVar5 < sVar37) {
                    iVar18 = (int)sVar37 - (int)sVar5;
                  }
                  lVar14 = (long)iVar18;
                  if (lVar16 <= lVar14) break;
                }
                pAVar21 = pAVar21->edge_next;
              } while (pAVar21 != pAVar23->first);
              if (lVar16 <= lVar14) goto LAB_00269039;
            }
            uVar30 = uVar36;
            local_68 = pAVar23;
          }
        }
LAB_00269039:
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar12);
      if (local_68 == (AF_Edge_conflict)0x0) goto LAB_00269070;
      pAVar40->edge_next = local_68->first;
      local_68->last->edge_next = pAVar40;
      local_68->last = pAVar40;
    }
    pAVar40 = pAVar40 + 1;
  } while( true );
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }